

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectorFederateManager.cpp
# Opt level: O3

Filter * __thiscall
helics::ConnectorFederateManager::getFilter(ConnectorFederateManager *this,int index)

{
  bool bVar1;
  pthread_rwlock_t *__rwlock;
  undefined1 *puVar2;
  
  bVar1 = (this->filters).enabled;
  if (bVar1 == true) {
    __rwlock = (pthread_rwlock_t *)&(this->filters).m_mutex;
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&__rwlock->__data);
  }
  else {
    __rwlock = (pthread_rwlock_t *)0x0;
  }
  puVar2 = invalidFilt;
  if ((-1 < index) && (index < (int)(this->filters).m_obj.dataStorage.csize)) {
    puVar2 = (undefined1 *)
             (this->filters).m_obj.dataStorage.dataptr[(uint)index >> 5][index & 0x1f]._M_t.
             super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>._M_t.
             super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
             super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl;
  }
  if (bVar1 != false) {
    pthread_rwlock_unlock(__rwlock);
  }
  return (Filter *)puVar2;
}

Assistant:

const Filter& ConnectorFederateManager::getFilter(int index) const
{
    auto sharedFilt = filters.lock_shared();
    if (isValidIndex(index, *sharedFilt)) {
        return *(*sharedFilt)[index];
    }
    return invalidFilt;
}